

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>const>>
          (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          *_other)

{
  Index nbRows;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  Index IVar1;
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *in_RSI;
  Index in_RDI;
  bool bVar2;
  Index othersize;
  CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  *other;
  
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  ::derived(in_RSI);
  nbRows = CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
           ::rows((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                   *)0x316921);
  CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  ::cols((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
          *)0x316930);
  this_00 = (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
            ::rows((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                    *)0x316949);
  CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  ::cols((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
          *)0x316958);
  IVar1 = CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
          ::rows((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                  *)0x316973);
  bVar2 = true;
  if (IVar1 != 1) {
    IVar1 = CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
            ::cols((CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                    *)0x31698c);
    bVar2 = IVar1 == 1;
  }
  if (!bVar2) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x147,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 2, 1>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_real_op<std::complex<double>>, const Eigen::Matrix<std::complex<double>, 2, 1>>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize(this_00,nbRows,in_RDI);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }